

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_7z.c
# Opt level: O2

int szipLoadEntry(SZIPinfo *info,PHYSFS_uint32 idx)

{
  byte bVar1;
  size_t *psVar2;
  size_t sVar3;
  size_t sVar4;
  Byte *pBVar5;
  SZIPinfo *dt;
  void *ptr;
  char *name;
  void *pvVar6;
  byte bVar7;
  int iVar8;
  undefined1 *puVar9;
  PHYSFS_uint64 *pPVar10;
  long lVar11;
  ulong uVar12;
  undefined1 auStack_48 [8];
  SZIPinfo *local_40;
  PHYSFS_uint32 local_34;
  
  pPVar10 = (PHYSFS_uint64 *)auStack_48;
  psVar2 = (info->db).FileNameOffsets;
  lVar11 = psVar2[(ulong)idx + 1] - psVar2[idx];
  uVar12 = lVar11 * 2;
  if (uVar12 < 0x100) {
    pPVar10 = (PHYSFS_uint64 *)(auStack_48 + -(uVar12 + 0x17 & 0xfffffffffffffff0));
    puVar9 = (undefined1 *)pPVar10;
  }
  else {
    puVar9 = (undefined1 *)0x0;
  }
  local_40 = info;
  local_34 = idx;
  *(undefined8 *)((long)pPVar10 + -8) = 0x11334e;
  ptr = __PHYSFS_initSmallAlloc(puVar9,uVar12);
  uVar12 = lVar11 * 4;
  iVar8 = 0;
  if (uVar12 < 0x100) {
    pPVar10 = (PHYSFS_uint64 *)((long)pPVar10 + -(uVar12 + 0x17 & 0xfffffffffffffff0));
    puVar9 = (undefined1 *)pPVar10;
  }
  else {
    puVar9 = (undefined1 *)0x0;
  }
  pPVar10[-1] = 0x11337e;
  name = (char *)__PHYSFS_initSmallAlloc(puVar9,uVar12);
  if ((ptr != (void *)0x0) && (name != (char *)0x0)) {
    psVar2 = (local_40->db).FileNameOffsets;
    bVar1 = (local_40->db).IsDirs[local_34 >> 3];
    bVar7 = (byte)local_34;
    sVar3 = psVar2[idx];
    sVar4 = psVar2[(ulong)idx + 1];
    pBVar5 = (local_40->db).FileNames;
    for (lVar11 = 0; sVar4 - sVar3 != lVar11; lVar11 = lVar11 + 1) {
      *(undefined2 *)((long)ptr + lVar11 * 2) = *(undefined2 *)(pBVar5 + lVar11 * 2 + sVar3 * 2);
    }
    pPVar10[-1] = 0x1133ff;
    PHYSFS_utf8FromUtf16((PHYSFS_uint16 *)pPVar10[2],(char *)pPVar10[1],*pPVar10);
    dt = local_40;
    pPVar10[-1] = 0x11340d;
    pvVar6 = __PHYSFS_DirTreeAdd(&dt->tree,name,(uint)((0x80U >> (bVar7 & 7) & (uint)bVar1) != 0));
    if (pvVar6 == (void *)0x0) {
      iVar8 = 0;
    }
    else {
      *(PHYSFS_uint32 *)((long)pvVar6 + 0x28) = local_34;
      pPVar10[-1] = 1;
      iVar8 = (int)pPVar10[-1];
    }
  }
  pPVar10[-1] = 0x113427;
  __PHYSFS_smallFree(name);
  pPVar10[-1] = 0x11342f;
  __PHYSFS_smallFree(ptr);
  return iVar8;
}

Assistant:

static int szipLoadEntry(SZIPinfo *info, const PHYSFS_uint32 idx)
{
    const size_t utf16len = SzArEx_GetFileNameUtf16(&info->db, idx, NULL);
    const size_t utf16buflen = utf16len * 2;
    PHYSFS_uint16 *utf16 = (PHYSFS_uint16 *) __PHYSFS_smallAlloc(utf16buflen);
    const size_t utf8buflen = utf16len * 4;
    char *utf8 = (char *) __PHYSFS_smallAlloc(utf8buflen);
    int retval = 0;

    if (utf16 && utf8)
    {
        const int isdir = SzArEx_IsDir(&info->db, idx) != 0;
        SZIPentry *entry;
        SzArEx_GetFileNameUtf16(&info->db, idx, (UInt16 *) utf16);
        PHYSFS_utf8FromUtf16(utf16, utf8, utf8buflen);
        entry = (SZIPentry*) __PHYSFS_DirTreeAdd(&info->tree, utf8, isdir);
        retval = (entry != NULL);
        if (retval)
            entry->dbidx = idx;
    } /* if */

    __PHYSFS_smallFree(utf8);
    __PHYSFS_smallFree(utf16);

    return retval;
}